

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

void __thiscall cppjieba::DictTrie::SetStaticWordWeights(DictTrie *this,UserWordWeightOption option)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  double dVar4;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> x;
  
  if ((this->static_node_infos_).
      super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->static_node_infos_).
      super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    limonp::Logger::Logger
              ((Logger *)&x,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/DictTrie.hpp"
               ,0xe0);
    poVar3 = std::operator<<((ostream *)&x,"exp: [!static_node_infos_.empty()");
    std::operator<<(poVar3,"] false. ");
    limonp::Logger::~Logger((Logger *)&x);
  }
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::vector
            (&x,&this->static_node_infos_);
  std::
  __sort<__gnu_cxx::__normal_iterator<cppjieba::DictUnit*,std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cppjieba::DictUnit_const&,cppjieba::DictUnit_const&)>>
            ((__normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
              )x.super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
              )x.super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl
               .super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_cppjieba::DictUnit_&,_const_cppjieba::DictUnit_&)>)
             0x11713a);
  dVar4 = (x.super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
           super__Vector_impl_data._M_start)->weight;
  this->min_weight_ = dVar4;
  dVar1 = x.super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].weight;
  this->max_weight_ = dVar1;
  dVar2 = *(double *)
           ((long)(&(x.super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>.
                     _M_impl.super__Vector_impl_data._M_start)->word + 1) +
           ((long)x.super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)x.super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 1 & 0xffffffffffffff80U));
  this->median_weight_ = dVar2;
  if ((option != WordWeightMin) && (dVar4 = dVar2, option != WordWeightMedian)) {
    dVar4 = dVar1;
  }
  this->user_word_default_weight_ = dVar4;
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::~vector(&x);
  return;
}

Assistant:

void SetStaticWordWeights(UserWordWeightOption option) {
    XCHECK(!static_node_infos_.empty());
    vector<DictUnit> x = static_node_infos_;
    sort(x.begin(), x.end(), WeightCompare);
    min_weight_ = x[0].weight;
    max_weight_ = x[x.size() - 1].weight;
    median_weight_ = x[x.size() / 2].weight;
    switch (option) {
     case WordWeightMin:
       user_word_default_weight_ = min_weight_;
       break;
     case WordWeightMedian:
       user_word_default_weight_ = median_weight_;
       break;
     default:
       user_word_default_weight_ = max_weight_;
       break;
    }
  }